

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_open_filename.c
# Opt level: O1

void test_open_filename(void)

{
  int iVar1;
  wchar_t wVar2;
  mode_t mVar3;
  archive_conflict *paVar4;
  la_ssize_t lVar5;
  time_t tVar6;
  long lVar7;
  char *pcVar8;
  la_int64_t lVar9;
  wchar_t *pwVar10;
  archive_entry *ae;
  char buff [64];
  archive_entry *local_80;
  undefined1 local_78 [72];
  
  paVar4 = (archive_conflict *)archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_filename.c"
                   ,L'#',(uint)(paVar4 != (archive_conflict *)0x0),
                   "(a = archive_write_new()) != NULL",(void *)0x0);
  iVar1 = archive_write_set_format_ustar((archive *)paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_filename.c"
                      ,L'$',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_ustar(a)",paVar4);
  iVar1 = archive_write_add_filter_none((archive *)paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_filename.c"
                      ,L'%',0,"ARCHIVE_OK",(long)iVar1,"archive_write_add_filter_none(a)",paVar4);
  wVar2 = archive_write_open_filename(paVar4,"test.tar");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_filename.c"
                      ,L'\'',0,"ARCHIVE_OK",(long)wVar2,
                      "archive_write_open_filename(a, \"test.tar\")",paVar4);
  local_80 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_filename.c"
                   ,L',',(uint)(local_80 != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_mtime(local_80,1,0);
  archive_entry_copy_pathname(local_80,"file");
  archive_entry_set_mode(local_80,0x81ed);
  archive_entry_set_size(local_80,8);
  iVar1 = archive_write_header((archive *)paVar4,local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_filename.c"
                      ,L'1',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",paVar4);
  archive_entry_free(local_80);
  lVar5 = archive_write_data((archive *)paVar4,"12345678",9);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_filename.c"
                      ,L'3',8,"8",lVar5,"archive_write_data(a, \"12345678\", 9)",paVar4);
  local_80 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_filename.c"
                   ,L'8',(uint)(local_80 != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_copy_pathname(local_80,"file2");
  archive_entry_set_mode(local_80,0x81ed);
  archive_entry_set_size(local_80,0xc8000);
  iVar1 = archive_write_header((archive *)paVar4,local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_filename.c"
                      ,L'<',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",paVar4);
  archive_entry_free(local_80);
  iVar1 = archive_write_close((archive *)paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_filename.c"
                      ,L'@',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",paVar4);
  iVar1 = archive_write_free((archive *)paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_filename.c"
                      ,L'A',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
  paVar4 = (archive_conflict *)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_filename.c"
                   ,L'F',(uint)(paVar4 != (archive_conflict *)0x0),
                   "(a = archive_read_new()) != NULL",(void *)0x0);
  iVar1 = archive_read_support_format_all((archive *)paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_filename.c"
                      ,L'G',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",paVar4);
  iVar1 = archive_read_support_filter_all((archive *)paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_filename.c"
                      ,L'H',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",paVar4);
  wVar2 = archive_read_open_filename(paVar4,"test.tar",0x200);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_filename.c"
                      ,L'J',0,"ARCHIVE_OK",(long)wVar2,
                      "archive_read_open_filename(a, \"test.tar\", 512)",paVar4);
  iVar1 = archive_read_next_header((archive *)paVar4,&local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_filename.c"
                      ,L'L',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",paVar4);
  tVar6 = archive_entry_mtime(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_filename.c"
                      ,L'M',1,"1",tVar6,"archive_entry_mtime(ae)",(void *)0x0);
  lVar7 = archive_entry_mtime_nsec(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_filename.c"
                      ,L'N',0,"0",lVar7,"archive_entry_mtime_nsec(ae)",(void *)0x0);
  tVar6 = archive_entry_atime(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_filename.c"
                      ,L'O',0,"0",tVar6,"archive_entry_atime(ae)",(void *)0x0);
  tVar6 = archive_entry_ctime(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_filename.c"
                      ,L'P',0,"0",tVar6,"archive_entry_ctime(ae)",(void *)0x0);
  pcVar8 = archive_entry_pathname(local_80);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_filename.c"
             ,L'Q',"file","\"file\"",pcVar8,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  mVar3 = archive_entry_mode(local_80);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_filename.c"
                   ,L'R',(uint)(mVar3 == 0x81ed),"(S_IFREG | 0755) == archive_entry_mode(ae)",
                   (void *)0x0);
  lVar9 = archive_entry_size(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_filename.c"
                      ,L'S',8,"8",lVar9,"archive_entry_size(ae)",(void *)0x0);
  lVar5 = archive_read_data((archive *)paVar4,local_78,10);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_filename.c"
                      ,L'T',8,"8",lVar5,"archive_read_data(a, buff, 10)",paVar4);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_filename.c"
                      ,L'U',local_78,"buff","12345678","\"12345678\"",8,"8",(void *)0x0);
  iVar1 = archive_read_next_header((archive *)paVar4,&local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_filename.c"
                      ,L'W',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",paVar4);
  pcVar8 = archive_entry_pathname(local_80);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_filename.c"
             ,L'X',"file2","\"file2\"",pcVar8,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  mVar3 = archive_entry_mode(local_80);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_filename.c"
                   ,L'Y',(uint)(mVar3 == 0x81ed),"(S_IFREG | 0755) == archive_entry_mode(ae)",
                   (void *)0x0);
  lVar9 = archive_entry_size(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_filename.c"
                      ,L'Z',0xc8000,"819200",lVar9,"archive_entry_size(ae)",(void *)0x0);
  iVar1 = archive_read_data_skip((archive *)paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_filename.c"
                      ,L'[',0,"ARCHIVE_OK",(long)iVar1,"archive_read_data_skip(a)",paVar4);
  iVar1 = archive_read_next_header((archive *)paVar4,&local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_filename.c"
                      ,L'^',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",paVar4);
  iVar1 = archive_read_close((archive *)paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_filename.c"
                      ,L'_',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",paVar4);
  iVar1 = archive_read_free((archive *)paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_filename.c"
                      ,L'`',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  paVar4 = (archive_conflict *)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_filename.c"
                   ,L'e',(uint)(paVar4 != (archive_conflict *)0x0),
                   "(a = archive_read_new()) != NULL",(void *)0x0);
  iVar1 = archive_read_support_format_all((archive *)paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_filename.c"
                      ,L'f',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",paVar4);
  iVar1 = archive_read_support_filter_all((archive *)paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_filename.c"
                      ,L'g',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",paVar4);
  wVar2 = archive_read_open_filename(paVar4,"nonexistent.tar",0x200);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_filename.c"
                      ,L'i',-0x1e,"ARCHIVE_FATAL",(long)wVar2,
                      "archive_read_open_filename(a, \"nonexistent.tar\", 512)",paVar4);
  iVar1 = archive_read_close((archive *)paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_filename.c"
                      ,L'j',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",paVar4);
  iVar1 = archive_read_free((archive *)paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_filename.c"
                      ,L'k',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  paVar4 = (archive_conflict *)archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_filename.c"
                   ,L'w',(uint)(paVar4 != (archive_conflict *)0x0),
                   "(a = archive_write_new()) != NULL",(void *)0x0);
  iVar1 = archive_write_set_format_ustar((archive *)paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_filename.c"
                      ,L'x',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_ustar(a)",paVar4);
  iVar1 = archive_write_add_filter_none((archive *)paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_filename.c"
                      ,L'y',0,"ARCHIVE_OK",(long)iVar1,"archive_write_add_filter_none(a)",paVar4);
  wVar2 = archive_write_open_filename_w(paVar4,anon_var_dwarf_4aada);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_filename.c"
                      ,L'{',0,"ARCHIVE_OK",(long)wVar2,
                      "archive_write_open_filename_w(a, L\"test.tar\")",paVar4);
  local_80 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_filename.c"
                   ,L'\x80',(uint)(local_80 != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_mtime(local_80,1,0);
  archive_entry_copy_pathname_w(local_80,anon_var_dwarf_4ffe3 + 0xf);
  archive_entry_set_mode(local_80,0x81ed);
  archive_entry_set_size(local_80,8);
  iVar1 = archive_write_header((archive *)paVar4,local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_filename.c"
                      ,L'\x85',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",paVar4);
  archive_entry_free(local_80);
  lVar5 = archive_write_data((archive *)paVar4,"12345678",9);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_filename.c"
                      ,L'\x87',8,"8",lVar5,"archive_write_data(a, \"12345678\", 9)",paVar4);
  local_80 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_filename.c"
                   ,L'\x8c',(uint)(local_80 != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_copy_pathname_w(local_80,anon_var_dwarf_4ff5c + 5);
  archive_entry_set_mode(local_80,0x81ed);
  archive_entry_set_size(local_80,0xc8000);
  iVar1 = archive_write_header((archive *)paVar4,local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_filename.c"
                      ,L'\x90',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",paVar4);
  archive_entry_free(local_80);
  iVar1 = archive_write_close((archive *)paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_filename.c"
                      ,L'\x94',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",paVar4);
  iVar1 = archive_write_free((archive *)paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_filename.c"
                      ,L'\x95',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
  paVar4 = (archive_conflict *)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_filename.c"
                   ,L'\x9a',(uint)(paVar4 != (archive_conflict *)0x0),
                   "(a = archive_read_new()) != NULL",(void *)0x0);
  iVar1 = archive_read_support_format_all((archive *)paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_filename.c"
                      ,L'\x9b',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",
                      paVar4);
  iVar1 = archive_read_support_filter_all((archive *)paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_filename.c"
                      ,L'\x9c',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",
                      paVar4);
  wVar2 = archive_read_open_filename_w(paVar4,anon_var_dwarf_4aada,0x200);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_filename.c"
                      ,L'\x9e',0,"ARCHIVE_OK",(long)wVar2,
                      "archive_read_open_filename_w(a, L\"test.tar\", 512)",paVar4);
  iVar1 = archive_read_next_header((archive *)paVar4,&local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_filename.c"
                      ,L'\xa0',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",paVar4)
  ;
  tVar6 = archive_entry_mtime(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_filename.c"
                      ,L'¡',1,"1",tVar6,"archive_entry_mtime(ae)",(void *)0x0);
  lVar7 = archive_entry_mtime_nsec(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_filename.c"
                      ,L'¢',0,"0",lVar7,"archive_entry_mtime_nsec(ae)",(void *)0x0);
  tVar6 = archive_entry_atime(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_filename.c"
                      ,L'£',0,"0",tVar6,"archive_entry_atime(ae)",(void *)0x0);
  tVar6 = archive_entry_ctime(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_filename.c"
                      ,L'¤',0,"0",tVar6,"archive_entry_ctime(ae)",(void *)0x0);
  pwVar10 = archive_entry_pathname_w(local_80);
  assertion_equal_wstring
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_filename.c"
             ,L'¥',anon_var_dwarf_4ffe3 + 0xf,"L\"file\"",pwVar10,"archive_entry_pathname_w(ae)",
             (void *)0x0);
  mVar3 = archive_entry_mode(local_80);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_filename.c"
                   ,L'¦',(uint)(mVar3 == 0x81ed),"(S_IFREG | 0755) == archive_entry_mode(ae)",
                   (void *)0x0);
  lVar9 = archive_entry_size(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_filename.c"
                      ,L'§',8,"8",lVar9,"archive_entry_size(ae)",(void *)0x0);
  lVar5 = archive_read_data((archive *)paVar4,local_78,10);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_filename.c"
                      ,L'¨',8,"8",lVar5,"archive_read_data(a, buff, 10)",paVar4);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_filename.c"
                      ,L'©',local_78,"buff","12345678","\"12345678\"",8,"8",(void *)0x0);
  iVar1 = archive_read_next_header((archive *)paVar4,&local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_filename.c"
                      ,L'«',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",paVar4);
  pwVar10 = archive_entry_pathname_w(local_80);
  assertion_equal_wstring
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_filename.c"
             ,L'¬',anon_var_dwarf_4ff5c + 5,"L\"file2\"",pwVar10,"archive_entry_pathname_w(ae)",
             (void *)0x0);
  mVar3 = archive_entry_mode(local_80);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_filename.c"
                   ,L'­',(uint)(mVar3 == 0x81ed),"(S_IFREG | 0755) == archive_entry_mode(ae)",
                   (void *)0x0);
  lVar9 = archive_entry_size(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_filename.c"
                      ,L'®',0xc8000,"819200",lVar9,"archive_entry_size(ae)",(void *)0x0);
  iVar1 = archive_read_data_skip((archive *)paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_filename.c"
                      ,L'¯',0,"ARCHIVE_OK",(long)iVar1,"archive_read_data_skip(a)",paVar4);
  iVar1 = archive_read_next_header((archive *)paVar4,&local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_filename.c"
                      ,L'²',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",paVar4);
  iVar1 = archive_read_close((archive *)paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_filename.c"
                      ,L'³',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",paVar4);
  iVar1 = archive_read_free((archive *)paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_filename.c"
                      ,L'´',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  paVar4 = (archive_conflict *)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_filename.c"
                   ,L'¹',(uint)(paVar4 != (archive_conflict *)0x0),
                   "(a = archive_read_new()) != NULL",(void *)0x0);
  iVar1 = archive_read_support_format_all((archive *)paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_filename.c"
                      ,L'º',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",paVar4)
  ;
  iVar1 = archive_read_support_filter_all((archive *)paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_filename.c"
                      ,L'»',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",paVar4)
  ;
  wVar2 = archive_read_open_filename_w(paVar4,anon_var_dwarf_4ab6a,0x200);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_filename.c"
                      ,L'½',-0x1e,"ARCHIVE_FATAL",(long)wVar2,
                      "archive_read_open_filename_w(a, L\"nonexistent.tar\", 512)",paVar4);
  iVar1 = archive_read_close((archive *)paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_filename.c"
                      ,L'¾',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",paVar4);
  iVar1 = archive_read_free((archive *)paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_filename.c"
                      ,L'¿',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

static void
test_open_filename_mbs(void)
{
	char buff[64];
	struct archive_entry *ae;
	struct archive *a;

	/* Write an archive through this FILE *. */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_ustar(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_add_filter_none(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_open_filename(a, "test.tar"));

	/*
	 * Write a file to it.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_mtime(ae, 1, 0);
	archive_entry_copy_pathname(ae, "file");
	archive_entry_set_mode(ae, S_IFREG | 0755);
	archive_entry_set_size(ae, 8);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);
	assertEqualIntA(a, 8, archive_write_data(a, "12345678", 9));

	/*
	 * Write a second file to it.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "file2");
	archive_entry_set_mode(ae, S_IFREG | 0755);
	archive_entry_set_size(ae, 819200);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);

	/* Close out the archive. */
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/*
	 * Now, read the data back.
	 */
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_open_filename(a, "test.tar", 512));

	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt(1, archive_entry_mtime(ae));
	assertEqualInt(0, archive_entry_mtime_nsec(ae));
	assertEqualInt(0, archive_entry_atime(ae));
	assertEqualInt(0, archive_entry_ctime(ae));
	assertEqualString("file", archive_entry_pathname(ae));
	assert((S_IFREG | 0755) == archive_entry_mode(ae));
	assertEqualInt(8, archive_entry_size(ae));
	assertEqualIntA(a, 8, archive_read_data(a, buff, 10));
	assertEqualMem(buff, "12345678", 8);

	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString("file2", archive_entry_pathname(ae));
	assert((S_IFREG | 0755) == archive_entry_mode(ae));
	assertEqualInt(819200, archive_entry_size(ae));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_data_skip(a));

	/* Verify the end of the archive. */
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

	/*
	 * Verify some of the error handling.
	 */
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_FATAL,
	    archive_read_open_filename(a, "nonexistent.tar", 512));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

}